

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

mbedtls_x509_crt *
x509_crt_find_parent_in
          (mbedtls_x509_crt *child,mbedtls_x509_crt *candidates,int top,size_t path_cnt,
          size_t self_cnt)

{
  int iVar1;
  ulong uVar2;
  mbedtls_x509_crt *pmVar3;
  
  if (candidates == (mbedtls_x509_crt *)0x0) {
    pmVar3 = (mbedtls_x509_crt *)0x0;
  }
  else {
    uVar2 = (path_cnt - self_cnt) + 1;
    pmVar3 = (mbedtls_x509_crt *)0x0;
    do {
      iVar1 = x509_name_cmp(&child->issuer,&candidates->subject);
      if (iVar1 == 0) {
        if ((top == 0) || (2 < candidates->version)) {
          if ((candidates->ca_istrue != 0) &&
             ((((candidates->ext_types & 4) == 0 || ((candidates->key_usage & 0x8005) == 4)) &&
              (candidates->max_pathlen < 1 || uVar2 <= (uint)candidates->max_pathlen)))) {
            if (top != 0) goto LAB_0011069d;
LAB_001106b0:
            iVar1 = mbedtls_x509_time_is_past(&candidates->valid_to);
            if ((iVar1 == 0) &&
               (iVar1 = mbedtls_x509_time_is_future(&candidates->valid_from), iVar1 == 0)) {
              return candidates;
            }
            if (pmVar3 == (mbedtls_x509_crt *)0x0) {
              pmVar3 = candidates;
            }
          }
        }
        else if (candidates->max_pathlen < 1 || uVar2 <= (uint)candidates->max_pathlen) {
LAB_0011069d:
          iVar1 = x509_crt_check_signature(child,candidates);
          if (iVar1 == 0) goto LAB_001106b0;
        }
      }
      candidates = candidates->next;
    } while (candidates != (mbedtls_x509_crt *)0x0);
  }
  return pmVar3;
}

Assistant:

static mbedtls_x509_crt *x509_crt_find_parent_in( mbedtls_x509_crt *child,
                                                  mbedtls_x509_crt *candidates,
                                                  int top,
                                                  size_t path_cnt,
                                                  size_t self_cnt )
{
    mbedtls_x509_crt *parent, *badtime_parent = NULL;

    for( parent = candidates; parent != NULL; parent = parent->next )
    {
        /* basic parenting skills (name, CA bit, key usage) */
        if( x509_crt_check_parent( child, parent, top ) != 0 )
            continue;

        /* +1 because stored max_pathlen is 1 higher that the actual value */
        if( parent->max_pathlen > 0 &&
            (size_t) parent->max_pathlen < 1 + path_cnt - self_cnt )
        {
            continue;
        }

        /* Signature */
        if( top && x509_crt_check_signature( child, parent ) != 0 )
        {
            continue;
        }

        /* optional time check */
        if( mbedtls_x509_time_is_past( &parent->valid_to ) ||
            mbedtls_x509_time_is_future( &parent->valid_from ) )
        {
            if( badtime_parent == NULL )
                badtime_parent = parent;

            continue;
        }

        break;
    }

    if( parent == NULL )
        parent = badtime_parent;

    return( parent );
}